

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall r_comp::Decompiler::write_expression_head(Decompiler *this,uint16_t read_index)

{
  Metadata *pMVar1;
  OutStream *pOVar2;
  undefined1 uVar3;
  ushort uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  size_type sVar6;
  undefined6 in_register_00000032;
  char *pcVar7;
  ostringstream *poVar8;
  ulong i;
  long lVar9;
  
  i = CONCAT62(in_register_00000032,read_index) & 0xffffffff;
  r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),i);
  uVar3 = r_code::Atom::getDescriptor();
  switch(uVar3) {
  case 0xc3:
  case 0xc4:
    lVar9 = 0xa8;
    goto LAB_00132bcd;
  case 0xc5:
    lVar9 = 0xc0;
LAB_00132bcd:
    pMVar1 = this->metadata;
    pOVar2 = this->out_stream;
    r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),i);
    uVar4 = r_code::Atom::asOpcode();
    pbVar5 = r_code::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           *)((long)&(pMVar1->classes)._M_h._M_buckets + lVar9),(ulong)uVar4);
    poVar8 = pOVar2->stream;
    pcVar7 = (pbVar5->_M_dataplus)._M_p;
    sVar6 = pbVar5->_M_string_length;
    break;
  default:
    poVar8 = this->out_stream->stream;
    pcVar7 = "undefined-class";
    sVar6 = 0xf;
    break;
  case 200:
    poVar8 = this->out_stream->stream;
    pcVar7 = "grp";
    goto LAB_00132c5d;
  case 0xc9:
  case 0xcb:
  case 0xcc:
    poVar8 = this->out_stream->stream;
    pcVar7 = "ipgm";
    sVar6 = 4;
    break;
  case 0xca:
    poVar8 = this->out_stream->stream;
    pcVar7 = "icpp_pgm";
    sVar6 = 8;
    break;
  case 0xcd:
    poVar8 = this->out_stream->stream;
    pcVar7 = "cst";
    goto LAB_00132c5d;
  case 0xce:
    poVar8 = this->out_stream->stream;
    pcVar7 = "mdl";
LAB_00132c5d:
    sVar6 = 3;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar8,pcVar7,sVar6);
  return;
}

Assistant:

void Decompiler::write_expression_head(uint16_t read_index)
{
    switch (current_object->code[read_index].getDescriptor()) {
    case Atom::OPERATOR:
        *out_stream << metadata->operator_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::OBJECT:
    case Atom::MARKER:
        *out_stream << metadata->class_names[current_object->code[read_index].asOpcode()];
        break;

    case Atom::INSTANTIATED_PROGRAM:
    case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
    case Atom::INSTANTIATED_ANTI_PROGRAM:
        *out_stream << "ipgm";
        break;

    case Atom::INSTANTIATED_CPP_PROGRAM:
        *out_stream << "icpp_pgm";
        break;

    case Atom::COMPOSITE_STATE:
        *out_stream << "cst";
        break;

    case Atom::MODEL:
        *out_stream << "mdl";
        break;

    case Atom::GROUP:
        *out_stream << "grp";
        break;

    default:
        *out_stream << "undefined-class";
        break;
    }
}